

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_scaling.c
# Opt level: O3

cupdlp_retcode
scale_problem(CUPDLPcsc *csc,cupdlp_float *cost,cupdlp_float *lower,cupdlp_float *upper,
             cupdlp_float *rhs,cupdlp_float *col_scaling,cupdlp_float *row_scaling)

{
  cupdlp_int len;
  int len_00;
  int iVar1;
  int *piVar2;
  cupdlp_int *pcVar3;
  cupdlp_float *pcVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  
  len = csc->nRows;
  len_00 = csc->nCols;
  cupdlp_cdiv(cost,col_scaling,len_00);
  cupdlp_cdot(lower,col_scaling,len_00);
  cupdlp_cdot(upper,col_scaling,len_00);
  cupdlp_cdiv(rhs,row_scaling,len);
  piVar2 = csc->colMatBeg;
  iVar5 = piVar2[len_00];
  if (0 < (long)iVar5) {
    pcVar3 = csc->colMatIdx;
    pcVar4 = csc->colMatElem;
    lVar6 = 0;
    do {
      pcVar4[lVar6] = pcVar4[lVar6] / row_scaling[pcVar3[lVar6]];
      lVar6 = lVar6 + 1;
    } while (iVar5 != lVar6);
  }
  if (0 < len_00) {
    lVar6 = 0;
    iVar5 = *piVar2;
    do {
      iVar1 = piVar2[lVar6 + 1];
      if (iVar5 < iVar1) {
        pcVar4 = csc->colMatElem;
        lVar7 = (long)iVar5;
        do {
          pcVar4[lVar7] = pcVar4[lVar7] / col_scaling[lVar6];
          lVar7 = lVar7 + 1;
        } while (iVar1 != lVar7);
      }
      lVar6 = lVar6 + 1;
      iVar5 = iVar1;
    } while (lVar6 != len_00);
  }
  return 0;
}

Assistant:

cupdlp_retcode scale_problem(CUPDLPcsc *csc, cupdlp_float *cost,
                             cupdlp_float *lower, cupdlp_float *upper,
                             cupdlp_float *rhs, cupdlp_float *col_scaling,
                             cupdlp_float *row_scaling) {
  cupdlp_retcode retcode = RETCODE_OK;
  cupdlp_int nRows = csc->nRows;
  cupdlp_int nCols = csc->nCols;

  cupdlp_cdiv(cost, col_scaling, nCols);
  cupdlp_cdot(lower, col_scaling, nCols);
  cupdlp_cdot(upper, col_scaling, nCols);
  cupdlp_cdiv(rhs, row_scaling, nRows);

  // row scaling
  for (int i = 0; i < csc->colMatBeg[nCols]; i++) {
    csc->colMatElem[i] /= row_scaling[csc->colMatIdx[i]];
  }
  // col scaling
  for (int i = 0; i < nCols; i++) {
    for (int j = csc->colMatBeg[i]; j < csc->colMatBeg[i + 1]; j++) {
      csc->colMatElem[j] /= col_scaling[i];
    }
  }

  // w->scaling->ifScaled = 1;

exit_cleanup:
  return retcode;
}